

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_chk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  ushort uVar1;
  int iVar2;
  TCGv_i32 arg3;
  TCGv_i32 arg2;
  int local_3c;
  int opsize;
  TCGv_i32 reg;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = insn >> 7 & 3;
  if (uVar1 == 2) {
    iVar2 = m68k_feature(env,0x19);
    if (iVar2 == 0) goto LAB_008c2cd2;
    local_3c = 2;
  }
  else {
    if (uVar1 != 3) {
LAB_008c2cd2:
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    local_3c = 1;
  }
  arg3 = gen_ea(env,s,insn,local_3c,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg3 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    arg2 = gen_extend(s,tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],local_3c,1);
    gen_flush_flags(s);
    gen_helper_chk(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
  }
  return;
}

Assistant:

DISAS_INSN(chk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, reg;
    int opsize;

    switch ((insn >> 7) & 3) {
    case 3:
        opsize = OS_WORD;
        break;
    case 2:
        if (m68k_feature(env, M68K_FEATURE_CHK2)) {
            opsize = OS_LONG;
            break;
        }
        /* fallthru */
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);

    gen_flush_flags(s);
    gen_helper_chk(tcg_ctx, tcg_ctx->cpu_env, reg, src);
}